

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

DFA * __thiscall re2::DFA::DumpState_abi_cxx11_(DFA *this,State *state)

{
  int local_3c;
  char *pcStack_38;
  int i;
  char *sep;
  allocator local_19;
  State *local_18;
  State *state_local;
  string *s;
  
  local_18 = state;
  state_local = (State *)this;
  if (state == (State *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"_",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else if (state == (State *)0x1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"X",(allocator *)((long)&sep + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&sep + 3));
  }
  else if (state == (State *)0x2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"*",(allocator *)((long)&sep + 2));
    std::allocator<char>::~allocator((allocator<char> *)((long)&sep + 2));
  }
  else {
    sep._1_1_ = 0;
    std::__cxx11::string::string((string *)this);
    pcStack_38 = "";
    StringAppendF((string *)this,"(%p)",local_18);
    for (local_3c = 0; local_3c < local_18->ninst_; local_3c = local_3c + 1) {
      if (local_18->inst_[local_3c] == -1) {
        StringAppendF((string *)this,"|");
        pcStack_38 = "";
      }
      else {
        StringAppendF((string *)this,"%s%d",pcStack_38,(ulong)(uint)local_18->inst_[local_3c]);
        pcStack_38 = ",";
      }
    }
    StringAppendF((string *)this," flag=%#x",(ulong)local_18->flag_);
  }
  return this;
}

Assistant:

string DFA::DumpState(State* state) {
  if (state == NULL)
    return "_";
  if (state == DeadState)
    return "X";
  if (state == FullMatchState)
    return "*";
  string s;
  const char* sep = "";
  StringAppendF(&s, "(%p)", state);
  for (int i = 0; i < state->ninst_; i++) {
    if (state->inst_[i] == Mark) {
      StringAppendF(&s, "|");
      sep = "";
    } else {
      StringAppendF(&s, "%s%d", sep, state->inst_[i]);
      sep = ",";
    }
  }
  StringAppendF(&s, " flag=%#x", state->flag_);
  return s;
}